

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::serialize
          (XMLAbstractDoubleFloat *this,XSerializeEngine *serEng)

{
  int type;
  XMLSize_t dummyDataLen;
  XMLSize_t dummyBufferLen;
  LiteralType local_34;
  XMLSize_t local_30;
  XMLSize_t local_28;
  
  XMLNumber::serialize(&this->super_XMLNumber,serEng);
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fValue);
    local_34 = NegINF;
    XSerializeEngine::operator>>(serEng,(int *)&local_34);
    this->fType = local_34;
    XSerializeEngine::operator>>(serEng,&this->fDataConverted);
    XSerializeEngine::operator>>(serEng,&this->fDataOverflowed);
    XSerializeEngine::operator>>(serEng,&this->fSign);
    XSerializeEngine::readString(serEng,&this->fRawData,&local_28,&local_30,false);
    this->fFormattedString = (XMLCh *)0x0;
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fValue);
  XSerializeEngine::operator<<(serEng,this->fType);
  XSerializeEngine::operator<<(serEng,this->fDataConverted);
  XSerializeEngine::operator<<(serEng,this->fDataOverflowed);
  XSerializeEngine::operator<<(serEng,this->fSign);
  XSerializeEngine::writeString(serEng,this->fRawData,0,false);
  return;
}

Assistant:

void XMLAbstractDoubleFloat::serialize(XSerializeEngine& serEng)
{
    //REVISIT: may not need to call base since it does nothing
    XMLNumber::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng << fValue;
        serEng << fType;
        serEng << fDataConverted;
        serEng << fDataOverflowed;
        serEng << fSign;

        serEng.writeString(fRawData);

        // Do not serialize fFormattedString

    }
    else
    {
        serEng >> fValue;

        int type = 0;
        serEng >> type;
        fType = (LiteralType) type;

        serEng >> fDataConverted;
        serEng >> fDataOverflowed;
        serEng >> fSign;

        serEng.readString(fRawData);

        // Set it to 0 force it to re-format if needed
        fFormattedString = 0;

    }

}